

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  initializer_list<unsigned_short> __l;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  pointer pPVar4;
  Events *pEVar5;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar6;
  pointer pEVar7;
  size_type sVar8;
  reference puVar9;
  Peers *pPVar10;
  ostream *poVar11;
  Peer *this_00;
  function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *this_01;
  int __n;
  PeerException *e_3;
  PeersReadMessage *local_370;
  PeersReadMessage *msg;
  iterator __end3;
  iterator __begin3;
  vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *__range3;
  undefined1 local_330 [40];
  vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> msgs;
  allocator<char> local_2d1;
  string local_2d0;
  int local_2b0;
  int local_2ac;
  int bytes;
  int peersCount;
  P2PSocketException *e_2;
  string local_278 [38];
  unsigned_short local_252;
  iterator iStack_250;
  unsigned_short port;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  P2PSocketException *e_1;
  sigaction action;
  int connected;
  int total;
  Event local_168;
  anon_class_1_0_00000001 local_121;
  function<void_(Peer_*)> local_120;
  Event local_100;
  P2PSocketException *e;
  string local_90;
  undefined4 local_6c;
  unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_> local_68;
  unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_> local_60;
  unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_> sock;
  undefined1 local_43 [27];
  vector<unsigned_short,_std::allocator<unsigned_short>_> knownPorts;
  char **argv_local;
  int argc_local;
  
  local_43._1_2_ = 0x1a66;
  local_43._3_8_ = local_43 + 1;
  local_43._11_8_ = 1;
  this_01 = (function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *)local_43;
  knownPorts.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)this_01);
  __l._M_len = local_43._11_8_;
  __l._M_array = (iterator)local_43._3_8_;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_43 + 0x13),__l,
             (allocator_type *)this_01);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)local_43);
  std::unique_ptr<P2PSocket,std::default_delete<P2PSocket>>::
  unique_ptr<std::default_delete<P2PSocket>,void>
            ((unique_ptr<P2PSocket,std::default_delete<P2PSocket>> *)&local_60,(nullptr_t)0x0);
  local_6c = 2;
  std::make_unique<P2PSocket,int>((int *)&local_68);
  std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::operator=(&local_60,&local_68);
  std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::~unique_ptr(&local_68);
  pPVar4 = std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::operator->(&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"127.0.0.1",(allocator<char> *)((long)&e + 7));
  P2PSocket::createServer(pPVar4,&local_90,0x22ba);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  pPVar4 = std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::operator->(&local_60);
  pEVar5 = P2PSocket::events(pPVar4);
  puVar6 = Events::onPeerConnect(pEVar5);
  pEVar7 = std::unique_ptr<Event,_std::default_delete<Event>_>::operator->(puVar6);
  std::function<void(Peer*)>::function<main::__0,void>
            ((function<void(Peer*)> *)&local_120,&local_121);
  Event::listen(&local_100,(int)pEVar7,(int)&local_120);
  Event::~Event(&local_100);
  std::function<void_(Peer_*)>::~function(&local_120);
  pPVar4 = std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::operator->(&local_60);
  pEVar5 = P2PSocket::events(pPVar4);
  puVar6 = Events::onPeerDisconnect(pEVar5);
  pEVar7 = std::unique_ptr<Event,_std::default_delete<Event>_>::operator->(puVar6);
  std::function<void(Peer*)>::function<main::__1,void>
            ((function<void(Peer*)> *)&total,(anon_class_1_0_00000001 *)((long)&connected + 3));
  Event::listen(&local_168,(int)pEVar7,(int)(function<void(Peer*)> *)&total);
  Event::~Event(&local_168);
  std::function<void_(Peer_*)>::~function((function<void_(Peer_*)> *)&total);
  sVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_43 + 0x13));
  action.sa_restorer._4_4_ = 0;
  e_1 = (P2PSocketException *)0x1;
  sigaction(0xd,(sigaction *)&e_1,(sigaction *)0x0);
  do {
    pPVar4 = std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::operator->(&local_60);
    P2PSocket::listen(pPVar4,0,__n);
    std::operator<<((ostream *)&std::cout,"listening\n");
    __end2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_43 + 0x13)
                       );
    iStack_250 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (local_43 + 0x13));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffdb0);
      if (!bVar1) break;
      puVar9 = __gnu_cxx::
               __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&__end2);
      local_252 = *puVar9;
      if (action.sa_restorer._4_4_ < (int)sVar8) {
        pPVar4 = std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::operator->(&local_60);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_278,"127.0.0.1",(allocator<char> *)((long)&e_2 + 7));
        P2PSocket::connect(pPVar4,(int)local_278,(sockaddr *)(ulong)local_252,(socklen_t)this_01);
        std::__cxx11::string::~string(local_278);
        std::allocator<char>::~allocator((allocator<char> *)((long)&e_2 + 7));
        action.sa_restorer._4_4_ = action.sa_restorer._4_4_ + 1;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&__end2);
    }
    pPVar4 = std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::operator->(&local_60);
    pPVar10 = P2PSocket::peers(pPVar4);
    local_2ac = Peers::count(pPVar10);
    if (0 < local_2ac) {
      pPVar4 = std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::operator->(&local_60);
      pPVar10 = P2PSocket::peers(pPVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"Broadcasting...",&local_2d1);
      this = &msgs.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      std::function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>::function
                ((function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *)this,
                 (nullptr_t)0x0);
      iVar3 = Peers::broadcast(pPVar10,&local_2d0,
                               (function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>
                                *)this);
      std::function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>::~function
                ((function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *)
                 &msgs.super__Vector_base<PeersReadMessage,_std::allocator<PeersReadMessage>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator(&local_2d1);
      local_2b0 = iVar3;
      poVar11 = std::operator<<((ostream *)&std::cout,"Sent: ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_2b0);
      std::operator<<(poVar11," msgs\n");
      pPVar4 = std::unique_ptr<P2PSocket,_std::default_delete<P2PSocket>_>::operator->(&local_60);
      pPVar10 = P2PSocket::peers(pPVar4);
      this_01 = (function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *)
                &__range3;
      std::function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>::function
                (this_01,(nullptr_t)0x0);
      Peers::read((Peers *)local_330,(int)pPVar10,(void *)0x400,(size_t)this_01);
      PeersMessages::all((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)
                         (local_330 + 0x20),(PeersMessages *)local_330);
      PeersMessages::~PeersMessages((PeersMessages *)local_330);
      std::function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)>::~function
                ((function<void_(const_std::unique_ptr<Peer,_std::default_delete<Peer>_>_&)> *)
                 &__range3);
      __end3 = std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::begin
                         ((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)
                          (local_330 + 0x20));
      msg = (PeersReadMessage *)
            std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::end
                      ((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)
                       (local_330 + 0x20));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<PeersReadMessage_*,_std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>_>
                                    *)&msg);
        if (!bVar1) break;
        local_370 = __gnu_cxx::
                    __normal_iterator<PeersReadMessage_*,_std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>_>
                    ::operator*(&__end3);
        poVar11 = std::operator<<((ostream *)&std::cout,"Recieved message: ");
        PeersReadMessage::message_abi_cxx11_((string *)&e_3,local_370);
        poVar11 = std::operator<<(poVar11,(string *)&e_3);
        poVar11 = std::operator<<(poVar11," from ");
        this_00 = PeersReadMessage::peer(local_370);
        uVar2 = Peer::port(this_00);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar2);
        std::operator<<(poVar11,"\n");
        std::__cxx11::string::~string((string *)&e_3);
        __gnu_cxx::
        __normal_iterator<PeersReadMessage_*,_std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>_>
        ::operator++(&__end3);
      }
      std::vector<PeersReadMessage,_std::allocator<PeersReadMessage>_>::~vector
                ((vector<PeersReadMessage,_std::allocator<PeersReadMessage>_> *)(local_330 + 0x20));
    }
    poVar11 = std::operator<<((ostream *)&std::cout,"Sleeping...");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,action.sa_restorer._4_4_);
    std::operator<<(poVar11,"\n");
    sleep(2);
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    std::vector<uint16_t> knownPorts = {
        6758,
    };

    std::unique_ptr<P2PSocket> sock = nullptr;

    try {
        sock = std::make_unique<P2PSocket>(2);
        sock->createServer("127.0.0.1", 8890);
    } catch(const P2PSocketException &e) {
        std::cout << e.what() << std::endl;
    }

    sock->events()->onPeerConnect()->listen(
        [](auto &&) { std::cout << "A new peer connected" << std::endl; });
    sock->events()->onPeerDisconnect()->listen(
        [](auto &&) { std::cout << "A peer disconnected" << std::endl; });

    int total = knownPorts.size();
    int connected = 0;

    struct sigaction action;
    action.sa_handler = SIG_IGN;
    sigaction(SIGPIPE, &action, 0);

    while (true) {
        try {
            sock->listen();
            std::cout << "listening\n";
        } catch (const P2PSocketException &e) {
            // std::cout << e.what() << std::endl;
        }

        for (auto port : knownPorts) {
            if (connected < total) {
                try {
                    sock->connect("127.0.0.1", port);
                } catch (const P2PSocketException &e) {
                    std::cout << e.what();
                }
                ++connected;
            }
        }

        auto peersCount = sock->peers()->count();

        if (peersCount > 0) {
            try {
                int bytes = sock->peers()->broadcast("Broadcasting...");
                std::cout << "Sent: " << bytes << " msgs\n";
            } catch (...) {
            }
            try {
                auto msgs = sock->peers()->read().all();
                for (const auto &msg : msgs) {
                    std::cout << "Recieved message: " << msg.message() << " from "
                              << msg.peer()->port() << "\n";
                }
            } catch (const PeerException &e) {
                std::cout << "No messages\n";
            }
        }

        std::cout << "Sleeping..." << connected << "\n";
        sleep(2);
    }

    std::cout << "Done, exiting...\n";
    return 0;
}